

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O1

void pzgeom::TPZQuadraticLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  TPZGeoNode *pTVar7;
  TPZGeoEl **ppTVar8;
  TPZGeoEl *pTVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int64_t index;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> scale;
  int64_t local_128;
  TPZVec<long> local_120;
  long local_100 [3];
  TPZVec<double> *local_e8;
  TPZVec<double> *local_e0;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZVec<long>::TPZVec(&local_120,0);
  local_120.fStore = local_100;
  local_120._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a3008;
  local_120.fNElements = 2;
  local_120.fNAlloc = 0;
  pdVar4 = size->fStore;
  pdVar5 = lowercorner->fStore;
  lVar10 = 0;
  do {
    local_68.super_TPZVec<double>.fStore[lVar10] = pdVar4[lVar10] / 3.0;
    local_a0.super_TPZVec<double>.fStore[lVar10] = pdVar5[lVar10] + 0.5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  local_e8 = lowercorner;
  local_e0 = size;
  do {
    pztopology::TPZLine::ParametricDomainNodeCoord((int)lVar10,&local_d8.super_TPZVec<double>);
    if (local_d8.super_TPZVec<double>.fNElements < 1) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        dVar1 = local_68.super_TPZVec<double>.fStore[uVar12];
        dVar2 = local_d8.super_TPZVec<double>.fStore[uVar12];
        dVar3 = local_a0.super_TPZVec<double>.fStore[uVar12];
        iVar6 = rand();
        local_d8.super_TPZVec<double>.fStore[uVar12] =
             ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 * dVar2 + dVar3 + -0.1;
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < local_d8.super_TPZVec<double>.fNElements);
    }
    TPZManVector<double,_3>::Resize(&local_d8,3);
    if ((uint)uVar12 < 3) {
      uVar12 = uVar12 & 0xffffffff;
      do {
        uVar13 = uVar12 + 1;
        dVar1 = local_a0.super_TPZVec<double>.fStore[uVar12];
        iVar6 = rand();
        local_d8.super_TPZVec<double>.fStore[uVar12] =
             ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 + -0.1;
        uVar12 = uVar13;
      } while ((int)uVar13 != 3);
    }
    iVar6 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_120.fStore[lVar10] = (long)iVar6;
    pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar6);
    TPZGeoNode::Initialize(pTVar7,&local_d8.super_TPZVec<double>,gmesh);
    bVar14 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar14);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,1,&local_120,(ulong)(uint)matid,&local_128,1);
  ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,local_128);
  pTVar9 = *ppTVar8;
  iVar6 = (**(code **)(*(long *)pTVar9 + 0xf0))(pTVar9);
  if (0 < iVar6) {
    iVar11 = 0;
    do {
      (**(code **)(*(long *)pTVar9 + 0x180))(pTVar9,iVar11);
      iVar11 = iVar11 + 1;
    } while (iVar6 != iVar11);
  }
  pTVar9 = TPZChangeEl::ChangeToQuadratic(gmesh,local_128);
  TPZGeoEl::NodePtr(pTVar9,2);
  pdVar4 = local_e8->fStore;
  pdVar5 = local_e0->fStore;
  lVar10 = 0;
  do {
    local_d8.super_TPZVec<double>.fStore[lVar10] = pdVar5[lVar10] * 0.5 + pdVar4[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  pTVar7 = TPZGeoEl::NodePtr(pTVar9,2);
  TPZGeoNode::SetCoord(pTVar7,&local_d8.super_TPZVec<double>);
  if (local_120.fStore == local_100) {
    local_120.fStore = (long *)0x0;
  }
  local_120.fNAlloc = 0;
  local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_120.fStore != (long *)0x0) {
    operator_delete__(local_120.fStore);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void TPZQuadraticLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,3> nodeindexes(2);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = 1./2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        int j;
        for (j=0; j<co.size(); j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        co.Resize(3);
        for (; j<3; j++) {
            co[j] = shift[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EOned, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is = 0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh,index);
    TPZGeoNode *nodeptr = gel->NodePtr(2);
    for (int i=0; i<3; i++) {
        co[i] = lowercorner[i]+size[i]/2.;
    }
    gel->NodePtr(2)->SetCoord(co);
}